

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O0

void ResizeNodeDistPages(void)

{
  NodeDist_t **ppNVar1;
  NodeDist_t **newNodeDistPages;
  int i;
  
  nodeDistPage = nodeDistPage + 1;
  ppNVar1 = nodeDistPages;
  if (nodeDistPage == maxNodeDistPages) {
    ppNVar1 = (NodeDist_t **)malloc((long)(maxNodeDistPages + 0x80) << 3);
    if (ppNVar1 == (NodeDist_t **)0x0) {
      for (newNodeDistPages._4_4_ = 0; newNodeDistPages._4_4_ < nodeDistPage;
          newNodeDistPages._4_4_ = newNodeDistPages._4_4_ + 1) {
        if (nodeDistPages[newNodeDistPages._4_4_] != (NodeDist_t *)0x0) {
          free(nodeDistPages[newNodeDistPages._4_4_]);
          nodeDistPages[newNodeDistPages._4_4_] = (NodeDist_t *)0x0;
        }
      }
      if (nodeDistPages != (NodeDist_t **)0x0) {
        free(nodeDistPages);
        nodeDistPages = (NodeDist_t **)0x0;
      }
      memOut = 1;
      return;
    }
    for (newNodeDistPages._4_4_ = 0; newNodeDistPages._4_4_ < maxNodeDistPages;
        newNodeDistPages._4_4_ = newNodeDistPages._4_4_ + 1) {
      ppNVar1[newNodeDistPages._4_4_] = nodeDistPages[newNodeDistPages._4_4_];
    }
    maxNodeDistPages = maxNodeDistPages + 0x80;
    if (nodeDistPages != (NodeDist_t **)0x0) {
      free(nodeDistPages);
    }
  }
  nodeDistPages = ppNVar1;
  currentNodeDistPage = (NodeDist_t *)malloc((long)nodeDistPageSize << 5);
  nodeDistPages[nodeDistPage] = currentNodeDistPage;
  if (currentNodeDistPage == (NodeDist_t *)0x0) {
    for (newNodeDistPages._4_4_ = 0; newNodeDistPages._4_4_ < nodeDistPage;
        newNodeDistPages._4_4_ = newNodeDistPages._4_4_ + 1) {
      if (nodeDistPages[newNodeDistPages._4_4_] != (NodeDist_t *)0x0) {
        free(nodeDistPages[newNodeDistPages._4_4_]);
        nodeDistPages[newNodeDistPages._4_4_] = (NodeDist_t *)0x0;
      }
    }
    if (nodeDistPages != (NodeDist_t **)0x0) {
      free(nodeDistPages);
      nodeDistPages = (NodeDist_t **)0x0;
    }
    memOut = 1;
  }
  else {
    nodeDistPageIndex = 0;
  }
  return;
}

Assistant:

static void
ResizeNodeDistPages(void)
{
    int i;
    NodeDist_t **newNodeDistPages;

    /* move to next page */
    nodeDistPage++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (nodeDistPage == maxNodeDistPages) {
        newNodeDistPages = ABC_ALLOC(NodeDist_t *,maxNodeDistPages + INITIAL_PAGES);
        if (newNodeDistPages == NULL) {
            for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
            ABC_FREE(nodeDistPages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxNodeDistPages; i++) {
                newNodeDistPages[i] = nodeDistPages[i];
            }
            /* Increase total page count */
            maxNodeDistPages += INITIAL_PAGES;
            ABC_FREE(nodeDistPages);
            nodeDistPages = newNodeDistPages;
        }
    }
    /* Allocate a new page */
    currentNodeDistPage = nodeDistPages[nodeDistPage] = ABC_ALLOC(NodeDist_t,
                                                              nodeDistPageSize);
    if (currentNodeDistPage == NULL) {
        for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
        ABC_FREE(nodeDistPages);
        memOut = 1;
        return;
    }
    /* reset page index */
    nodeDistPageIndex = 0;
    return;

}